

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

int stbtt_GetKerningTable(stbtt_fontinfo *info,stbtt_kerningentry *table,int table_length)

{
  uchar *puVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  lVar3 = (long)info->kern;
  uVar5 = 0;
  if (((lVar3 != 0) && (puVar1 = info->data, puVar1[lVar3 + 3] != '\0' || puVar1[lVar3 + 2] != '\0')
      ) && ((ushort)(*(ushort *)(puVar1 + lVar3 + 8) << 8 | *(ushort *)(puVar1 + lVar3 + 8) >> 8) ==
            1)) {
    uVar2 = (uint)(ushort)(*(ushort *)(puVar1 + lVar3 + 10) << 8 |
                          *(ushort *)(puVar1 + lVar3 + 10) >> 8);
    uVar5 = table_length;
    if ((int)uVar2 < table_length) {
      uVar5 = uVar2;
    }
    lVar4 = 0;
    uVar6 = 0;
    if (0 < (int)uVar5) {
      uVar6 = (ulong)uVar5;
    }
    for (; uVar6 * 6 - lVar4 != 0; lVar4 = lVar4 + 6) {
      *(uint *)((long)&table->glyph1 + lVar4 * 2) =
           (uint)(ushort)(*(ushort *)(puVar1 + lVar4 + lVar3 + 0x12) << 8 |
                         *(ushort *)(puVar1 + lVar4 + lVar3 + 0x12) >> 8);
      *(uint *)((long)&table->glyph2 + lVar4 * 2) =
           (uint)(ushort)(*(ushort *)(puVar1 + lVar4 + lVar3 + 0x14) << 8 |
                         *(ushort *)(puVar1 + lVar4 + lVar3 + 0x14) >> 8);
      *(uint *)((long)&table->advance + lVar4 * 2) =
           (int)(short)((ushort)puVar1[lVar4 + lVar3 + 0x16] << 8) |
           (uint)puVar1[lVar4 + lVar3 + 0x17];
    }
  }
  return uVar5;
}

Assistant:

STBTT_DEF int stbtt_GetKerningTable(const stbtt_fontinfo *info, stbtt_kerningentry* table, int table_length)
{
   stbtt_uint8 *data = info->data + info->kern;
   int k, length;

   // we only look at the first table. it must be 'horizontal' and format 0.
   if (!info->kern)
      return 0;
   if (ttUSHORT(data+2) < 1) // number of tables, need at least 1
      return 0;
   if (ttUSHORT(data+8) != 1) // horizontal flag must be set in format
      return 0;

   length = ttUSHORT(data+10);
   if (table_length < length)
      length = table_length;

   for (k = 0; k < length; k++)
   {
      table[k].glyph1 = ttUSHORT(data+18+(k*6));
      table[k].glyph2 = ttUSHORT(data+20+(k*6));
      table[k].advance = ttSHORT(data+22+(k*6));
   }

   return length;
}